

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderInvarianceRule4Test::isVertexDefined
          (TessellationShaderInvarianceRule4Test *this,float *vertex_data,uint n_vertices,
          float *vertex_data_seeked,uint n_vertex_data_seeked_components)

{
  float *pfVar1;
  float *current_vertex_data;
  uint n_vertex;
  bool result;
  uint n_vertex_data_seeked_components_local;
  float *vertex_data_seeked_local;
  uint n_vertices_local;
  float *vertex_data_local;
  TessellationShaderInvarianceRule4Test *this_local;
  
  current_vertex_data._4_4_ = 0;
  do {
    if (n_vertices <= current_vertex_data._4_4_) {
      return false;
    }
    pfVar1 = vertex_data + current_vertex_data._4_4_ * 3;
    if ((*vertex_data_seeked == *pfVar1) && (!NAN(*vertex_data_seeked) && !NAN(*pfVar1))) {
      if ((vertex_data_seeked[1] == pfVar1[1]) && (!NAN(vertex_data_seeked[1]) && !NAN(pfVar1[1])))
      {
        if (n_vertex_data_seeked_components < 3) {
          return true;
        }
        if (2 < n_vertex_data_seeked_components) {
          if ((vertex_data_seeked[2] == pfVar1[2]) &&
             (!NAN(vertex_data_seeked[2]) && !NAN(pfVar1[2]))) {
            return true;
          }
        }
      }
    }
    current_vertex_data._4_4_ = current_vertex_data._4_4_ + 1;
  } while( true );
}

Assistant:

bool TessellationShaderInvarianceRule4Test::isVertexDefined(const float* vertex_data, unsigned int n_vertices,
															const float* vertex_data_seeked,
															unsigned int n_vertex_data_seeked_components)
{
	bool result = false;

	DE_ASSERT(n_vertex_data_seeked_components >= 2);

	for (unsigned int n_vertex = 0; n_vertex < n_vertices; ++n_vertex)
	{
		const float* current_vertex_data = vertex_data + 3 /* components */ * n_vertex;

		if ((vertex_data_seeked[0] == current_vertex_data[0]) && (vertex_data_seeked[1] == current_vertex_data[1]) &&
			((n_vertex_data_seeked_components < 3) ||
			 (n_vertex_data_seeked_components >= 3 && (vertex_data_seeked[2] == current_vertex_data[2]))))
		{
			result = true;

			break;
		} /* if (components match) */
	}	 /* for (all vertices) */

	return result;
}